

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O2

bool __thiscall lzham::symbol_codec::arith_renorm_enc_interval(symbol_codec *this)

{
  bool bVar1;
  uint uVar2;
  uint uVar3;
  uchar local_19;
  
  uVar2 = this->m_arith_base;
  do {
    local_19 = (uchar)(uVar2 >> 0x18);
    bVar1 = vector<unsigned_char>::try_push_back(&this->m_arith_output_buf,&local_19);
    if (!bVar1) {
      return bVar1;
    }
    this->m_total_bits_written = this->m_total_bits_written + 8;
    uVar2 = this->m_arith_base << 8;
    this->m_arith_base = uVar2;
    uVar3 = this->m_arith_length << 8;
    this->m_arith_length = uVar3;
  } while (uVar3 < 0x1000000);
  return bVar1;
}

Assistant:

bool symbol_codec::arith_renorm_enc_interval()
   {
      do
      {
         if (!m_arith_output_buf.try_push_back( (m_arith_base >> 24) & 0xFF ))
            return false;
         m_total_bits_written += 8;

         m_arith_base <<= 8;
      } while ((m_arith_length <<= 8) < cSymbolCodecArithMinLen);
      return true;
   }